

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O3

void __thiscall xray_re::xr_ogf_v4::load_kinematics_animated(xr_ogf_v4 *this,xr_reader *r)

{
  byte *pbVar1;
  string *psVar2;
  uint *puVar3;
  size_t sVar4;
  xr_reader *r_00;
  ulong uVar5;
  xr_reader *s;
  xr_reader *local_28;
  
  load_kinematics(this,r);
  sVar4 = xr_reader::find_chunk(r,0x13);
  if (sVar4 == 0) {
    sVar4 = xr_reader::find_chunk(r,0x18);
    if (sVar4 == 0) {
      r_00 = xr_reader::open_chunk(r,0xf);
      local_28 = r_00;
      if (r_00 == (xr_reader *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                      ,0x247,"void xray_re::xr_ogf_v4::load_kinematics_animated(xr_reader &)");
      }
      load_s_smparams(this,r_00);
      if ((r_00->field_2).m_p <= r_00->m_end) {
        if ((r_00->field_2).m_p != r_00->m_end) {
          __assert_fail("s->eof()",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                        ,0x249,"void xray_re::xr_ogf_v4::load_kinematics_animated(xr_reader &)");
        }
        xr_reader::close_chunk(r,&local_28);
        local_28 = xr_reader::open_chunk(r,0xe);
        if (local_28 == (xr_reader *)0x0) {
          __assert_fail("s",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                        ,0x24d,"void xray_re::xr_ogf_v4::load_kinematics_animated(xr_reader &)");
        }
        load_s_motions(this,local_28);
        if ((local_28->field_2).m_p <= local_28->m_end) {
          if ((local_28->field_2).m_p == local_28->m_end) {
            xr_reader::close_chunk(r,&local_28);
            return;
          }
          __assert_fail("s->eof()",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                        ,0x24f,"void xray_re::xr_ogf_v4::load_kinematics_animated(xr_reader &)");
        }
      }
      __assert_fail("m_p <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                    ,0x7e,"bool xray_re::xr_reader::eof() const");
    }
    puVar3 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
    uVar5 = (ulong)*puVar3;
    if (uVar5 != 0) {
      psVar2 = &(this->super_xr_ogf).super_xr_object.m_motion_refs;
      while( true ) {
        xr_reader::skip_sz(r);
        std::__cxx11::string::append((char *)psVar2);
        uVar5 = uVar5 - 1;
        if (uVar5 == 0) break;
        std::__cxx11::string::push_back((char)psVar2);
      }
    }
    pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 3);
    *pbVar1 = *pbVar1 | 1;
  }
  else {
    xr_reader::r_sz(r,&(this->super_xr_ogf).super_xr_object.m_motion_refs);
    pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 2);
    *pbVar1 = *pbVar1 | 8;
  }
  return;
}

Assistant:

void xr_ogf_v4::load_kinematics_animated(xr_reader& r)
{
	load_kinematics(r);
	if (r.find_chunk(OGF4_S_MOTION_REFS_0)) {
		load_s_motion_refs_0(r);
		r.debug_find_chunk();
	} else if (r.find_chunk(OGF4_S_MOTION_REFS_1)) {
		load_s_motion_refs_1(r);
		r.debug_find_chunk();
	} else {
		xr_reader* s = r.open_chunk(OGF4_S_SMPARAMS);
		xr_assert(s);
		load_s_smparams(*s);
		assert(s->eof());
		r.close_chunk(s);

		s = r.open_chunk(OGF4_S_MOTIONS);
		xr_assert(s);
		load_s_motions(*s);
		assert(s->eof());
		r.close_chunk(s);
	}
}